

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexPacket.cpp
# Opt level: O3

vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> * __thiscall
rr::VertexPacketAllocator::allocArray
          (vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *__return_storage_ptr__,
          VertexPacketAllocator *this,size_t count)

{
  pointer *pppcVar1;
  iterator __position;
  VertexPacket *pVVar2;
  long lVar3;
  deInt8 *ptr;
  VertexPacket *local_48;
  VertexPacket *local_40;
  VertexPacket *local_38;
  
  if (count == 0) {
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    lVar3 = 0x30;
    if (this->m_numberOfVertexOutputs != 0) {
      lVar3 = this->m_numberOfVertexOutputs * 0x10 + 0x20;
    }
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pVVar2 = (VertexPacket *)operator_new__(lVar3 * count);
    local_48 = pVVar2;
    local_40 = pVVar2;
    do {
      (pVVar2->position).m_data[0] = 0.0;
      (pVVar2->position).m_data[1] = 0.0;
      (pVVar2->position).m_data[2] = 0.0;
      (pVVar2->position).m_data[3] = 0.0;
      *(undefined8 *)&pVVar2->outputs[0].v = 0;
      *(undefined8 *)((long)&pVVar2->outputs[0].v + 8) = 0;
      local_38 = pVVar2;
      std::vector<rr::VertexPacket*,std::allocator<rr::VertexPacket*>>::
      emplace_back<rr::VertexPacket*>
                ((vector<rr::VertexPacket*,std::allocator<rr::VertexPacket*>> *)
                 __return_storage_ptr__,&local_38);
      pVVar2 = (VertexPacket *)((long)(pVVar2->position).m_data + lVar3 + -8);
      count = count - 1;
    } while (count != 0);
    __position._M_current =
         (this->m_allocations).super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_allocations).super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<signed_char*,std::allocator<signed_char*>>::_M_realloc_insert<signed_char*const&>
                ((vector<signed_char*,std::allocator<signed_char*>> *)&this->m_allocations,
                 __position,(char **)&local_48);
    }
    else {
      *__position._M_current = (char *)local_40;
      pppcVar1 = &(this->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VertexPacket*> VertexPacketAllocator::allocArray (size_t count)
{
	if (!count)
		return std::vector<VertexPacket*>();

	const size_t extraVaryings	= (m_numberOfVertexOutputs == 0) ? (0) : (m_numberOfVertexOutputs-1);
	const size_t packetSize		= sizeof(VertexPacket) + extraVaryings * sizeof(GenericVec4);

	std::vector<VertexPacket*>	retVal;
	deInt8*						ptr = new deInt8[packetSize * count]; // throws bad_alloc => ok

	// *.push_back might throw bad_alloc
	try
	{
		// run ctors
		for (size_t i = 0; i < count; ++i)
			retVal.push_back(new (ptr + i*packetSize) VertexPacket()); // throws bad_alloc

		m_allocations.push_back(ptr); // throws bad_alloc
	}
	catch (std::bad_alloc& )
	{
		delete [] ptr;
		throw;
	}

	return retVal;
}